

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O3

wchar_t parse_htime_item(archive_read *a,char unix_time,int64_t *sec,uint32_t *nsec,
                        int64_t *extra_data_size)

{
  uint64_t ntfs;
  char cVar1;
  undefined7 extraout_var;
  uint64_t *puVar2;
  uint64_t *extraout_RAX;
  uint32_t time_val;
  ssize_t avail;
  uint local_34;
  ssize_t local_30;
  
  if (unix_time == '\0') {
    local_30 = -1;
    puVar2 = (uint64_t *)__archive_read_ahead(a,8,&local_30);
    if (puVar2 != (uint64_t *)0x0) {
      ntfs = *puVar2;
      puVar2 = (uint64_t *)__archive_read_consume(a,8);
      if (puVar2 == (uint64_t *)0x8) {
        ntfs_to_unix(ntfs,sec,nsec);
        *extra_data_size = *extra_data_size + -8;
        puVar2 = extraout_RAX;
      }
    }
  }
  else {
    cVar1 = read_u32(a,&local_34);
    puVar2 = (uint64_t *)CONCAT71(extraout_var,cVar1);
    if (cVar1 != '\0') {
      *extra_data_size = *extra_data_size + -4;
      puVar2 = (uint64_t *)(ulong)local_34;
      *sec = (int64_t)puVar2;
    }
  }
  return (wchar_t)puVar2;
}

Assistant:

static int parse_htime_item(struct archive_read* a, char unix_time,
    int64_t* sec, uint32_t* nsec, int64_t* extra_data_size)
{
	if(unix_time) {
		uint32_t time_val;
		if(!read_u32(a, &time_val))
			return ARCHIVE_EOF;

		*extra_data_size -= 4;
		*sec = (int64_t) time_val;
	} else {
		uint64_t windows_time;
		if(!read_u64(a, &windows_time))
			return ARCHIVE_EOF;

		ntfs_to_unix(windows_time, sec, nsec);
		*extra_data_size -= 8;
	}

	return ARCHIVE_OK;
}